

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void yyerror(char *s,...)

{
  char in_AL;
  int iVar1;
  ushort **ppuVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list aq;
  va_list ap;
  undefined1 auStack_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_8;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f0 = in_RSI;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_8 = in_RDI;
  reportpreyyerror();
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  pre_yyerror_line = yylloc.first_line;
  local_18 = auStack_f8;
  incerrorstate();
  vsnprintf(pre_yyerror_buf,0x7f,local_8,&local_28);
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[(int)pre_yyerror_buf[0]] & 0x200) != 0) {
    iVar1 = toupper((int)pre_yyerror_buf[0]);
    pre_yyerror_buf[0] = (char)iVar1;
  }
  return;
}

Assistant:

void yyerror(const char *s, ...) {
    reportpreyyerror();

    va_list ap, __attribute__((unused)) aq; /* aq may be unused */
    va_start(ap, s);
    pre_yyerror_line = yylloc.first_line;
    incerrorstate();

#ifndef NOYYERROR
    va_copy(aq, ap);
    typeerror(2, s, aq);
    va_end(aq);
#endif

    vsnprintf(pre_yyerror_buf, 127, s, ap);
    if (islower(pre_yyerror_buf[0]))
        pre_yyerror_buf[0] = (char)toupper(pre_yyerror_buf[0]);
    va_end(ap);
}